

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O3

void __thiscall duckdb::ArrowRunEndEncodingState::Reset(ArrowRunEndEncodingState *this)

{
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr_00;
  
  __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
       (this->run_ends).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>;
  (this->run_ends).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false> = (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0;
  if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)this,
               (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
  }
  __ptr_00._M_head_impl =
       (this->values).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (this->values).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  if (__ptr_00._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&this->values,__ptr_00._M_head_impl);
    return;
  }
  return;
}

Assistant:

void Reset() {
		run_ends.reset();
		values.reset();
	}